

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O3

Fl_Double_Window * make_layout_window(void)

{
  uint *puVar1;
  Fl_Int_Input *pFVar2;
  Fl_Check_Button *pFVar3;
  Fl_Boxtype FVar4;
  Fl_Double_Window *pFVar5;
  Fl_Widget *pFVar6;
  Fl_Button *this;
  Fl_Box *pFVar7;
  Fl_Group *this_00;
  Fl_Round_Button *pFVar8;
  
  pFVar5 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar5,0x136,0xf5,"Layout Settings");
  grid_window = pFVar5;
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Int_Input::Fl_Int_Input((Fl_Int_Input *)pFVar6,0x74,10,0x32,0x19,"x");
  horizontal_input = (Fl_Int_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Horizontal grid spacing.");
  pFVar2 = horizontal_input;
  (horizontal_input->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ = '\x02';
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.callback_ = grid_cb;
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.user_data_ = &DAT_00000001;
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.label_.align_ = 8;
  pFVar6->when_ = '\f';
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Int_Input::Fl_Int_Input((Fl_Int_Input *)pFVar6,0xb3,10,0x32,0x19,"pixels");
  vertical_input = (Fl_Int_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Vertical grid spacing.");
  pFVar2 = vertical_input;
  (vertical_input->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ = '\x02';
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.callback_ = grid_cb;
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.user_data_ = &DAT_00000002;
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.label_.align_ = 8;
  pFVar6->when_ = '\f';
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Int_Input::Fl_Int_Input((Fl_Int_Input *)pFVar6,0x74,0x2d,0x32,0x19,"pixel snap");
  snap_input = (Fl_Int_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Snap to grid within this many pixels.");
  pFVar2 = snap_input;
  (snap_input->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ = '\x02';
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_ = '\a';
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.callback_ = grid_cb;
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.user_data_ = &DAT_00000003;
  (pFVar2->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.label_.align_ = 8;
  pFVar6->when_ = '\f';
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button((Fl_Check_Button *)pFVar6,0x74,0x50,0x6e,0x19,"Show Guides");
  guides_toggle = (Fl_Check_Button *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Show distance and alignment guides in overlay");
  pFVar3 = guides_toggle;
  (guides_toggle->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar3->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ = guides_cb;
  (pFVar3->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_00000004;
  this = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this,0xf0,0xd2,0x3c,0x19,"Close");
  Fl_Widget::tooltip((Fl_Widget *)this,"Close this dialog.");
  (this->super_Fl_Widget).callback_ = cb_Close2;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0x2f,10,0x46,0x19,"Grid:");
  (pFVar7->super_Fl_Widget).label_.font = 1;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x18;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,10,0x73,0x6b,0x19,"Widget Size:");
  (pFVar7->super_Fl_Widget).label_.font = 1;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x18;
  this_00 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(this_00,0x69,0x73,0xaa,0x4b,(char *)0x0);
  pFVar8 = (Fl_Round_Button *)operator_new(0x80);
  Fl_Round_Button::Fl_Round_Button(pFVar8,0x73,0x73,0x46,0x19,(char *)0x0);
  def_widget_size[0] = pFVar8;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.type_ = 'f';
  FVar4 = fl_define_FL_ROUND_UP_BOX();
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.down_box_ = (char)FVar4 + '\x01';
  pFVar8 = def_widget_size[0];
  (def_widget_size[0]->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       default_widget_size_cb;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_00000008;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0x82,0x73,0x32,0x19,"tiny");
  (pFVar7->super_Fl_Widget).label_.size = 8;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x14;
  pFVar8 = (Fl_Round_Button *)operator_new(0x80);
  Fl_Round_Button::Fl_Round_Button(pFVar8,0xca,0x73,0x46,0x19,(char *)0x0);
  def_widget_size[1] = pFVar8;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.type_ = 'f';
  FVar4 = fl_define_FL_ROUND_UP_BOX();
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.down_box_ = (char)FVar4 + '\x01';
  pFVar8 = def_widget_size[1];
  (def_widget_size[1]->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       default_widget_size_cb;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_0000000b;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0xda,0x73,0x32,0x19,"small");
  (pFVar7->super_Fl_Widget).label_.size = 0xb;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x14;
  pFVar8 = (Fl_Round_Button *)operator_new(0x80);
  Fl_Round_Button::Fl_Round_Button(pFVar8,0x73,0x8c,0x46,0x19,(char *)0x0);
  def_widget_size[2] = pFVar8;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.type_ = 'f';
  FVar4 = fl_define_FL_ROUND_UP_BOX();
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.down_box_ = (char)FVar4 + '\x01';
  pFVar8 = def_widget_size[2];
  (def_widget_size[2]->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       default_widget_size_cb;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_0000000e;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0x82,0x8c,0x32,0x19,"normal");
  (pFVar7->super_Fl_Widget).label_.align_ = 0x14;
  pFVar8 = (Fl_Round_Button *)operator_new(0x80);
  Fl_Round_Button::Fl_Round_Button(pFVar8,0xca,0x8c,0x5a,0x19,(char *)0x0);
  def_widget_size[3] = pFVar8;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.type_ = 'f';
  FVar4 = fl_define_FL_ROUND_UP_BOX();
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.down_box_ = (char)FVar4 + '\x01';
  pFVar8 = def_widget_size[3];
  (def_widget_size[3]->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       default_widget_size_cb;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_00000012;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0xda,0x8c,0x44,0x19,"medium");
  (pFVar7->super_Fl_Widget).label_.size = 0x12;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x14;
  pFVar8 = (Fl_Round_Button *)operator_new(0x80);
  Fl_Round_Button::Fl_Round_Button(pFVar8,0x73,0xa5,0x4b,0x19,(char *)0x0);
  def_widget_size[4] = pFVar8;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.type_ = 'f';
  FVar4 = fl_define_FL_ROUND_UP_BOX();
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.down_box_ = (char)FVar4 + '\x01';
  pFVar8 = def_widget_size[4];
  (def_widget_size[4]->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       default_widget_size_cb;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_00000018;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0x82,0xa5,0x40,0x19,"large");
  (pFVar7->super_Fl_Widget).label_.size = 0x18;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x14;
  pFVar8 = (Fl_Round_Button *)operator_new(0x80);
  Fl_Round_Button::Fl_Round_Button(pFVar8,0xca,0xa5,0x5f,0x19,(char *)0x0);
  def_widget_size[5] = pFVar8;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.type_ = 'f';
  FVar4 = fl_define_FL_ROUND_UP_BOX();
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.down_box_ = (char)FVar4 + '\x01';
  pFVar8 = def_widget_size[5];
  (def_widget_size[5]->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       default_widget_size_cb;
  (pFVar8->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.user_data_ = &DAT_00000020;
  pFVar7 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar7,0xda,0xa5,0x4c,0x19,"huge");
  (pFVar7->super_Fl_Widget).label_.size = 0x20;
  (pFVar7->super_Fl_Widget).label_.align_ = 0x14;
  Fl_Group::end(this_00);
  pFVar5 = grid_window;
  puVar1 = &(grid_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x20;
  Fl_Group::end((Fl_Group *)pFVar5);
  return grid_window;
}

Assistant:

Fl_Double_Window* make_layout_window() {
  { grid_window = new Fl_Double_Window(310, 245, "Layout Settings");
    { Fl_Int_Input* o = horizontal_input = new Fl_Int_Input(116, 10, 50, 25, "x");
      horizontal_input->tooltip("Horizontal grid spacing.");
      horizontal_input->type(2);
      horizontal_input->box(FL_THIN_DOWN_BOX);
      horizontal_input->callback((Fl_Callback*)grid_cb, (void*)(1));
      horizontal_input->align(Fl_Align(FL_ALIGN_RIGHT));
      o->when(FL_WHEN_RELEASE|FL_WHEN_ENTER_KEY);
    } // Fl_Int_Input* horizontal_input
    { Fl_Int_Input* o = vertical_input = new Fl_Int_Input(179, 10, 50, 25, "pixels");
      vertical_input->tooltip("Vertical grid spacing.");
      vertical_input->type(2);
      vertical_input->box(FL_THIN_DOWN_BOX);
      vertical_input->callback((Fl_Callback*)grid_cb, (void*)(2));
      vertical_input->align(Fl_Align(FL_ALIGN_RIGHT));
      o->when(FL_WHEN_RELEASE|FL_WHEN_ENTER_KEY);
    } // Fl_Int_Input* vertical_input
    { Fl_Int_Input* o = snap_input = new Fl_Int_Input(116, 45, 50, 25, "pixel snap");
      snap_input->tooltip("Snap to grid within this many pixels.");
      snap_input->type(2);
      snap_input->box(FL_THIN_DOWN_BOX);
      snap_input->callback((Fl_Callback*)grid_cb, (void*)(3));
      snap_input->align(Fl_Align(FL_ALIGN_RIGHT));
      o->when(FL_WHEN_RELEASE|FL_WHEN_ENTER_KEY);
    } // Fl_Int_Input* snap_input
    { guides_toggle = new Fl_Check_Button(116, 80, 110, 25, "Show Guides");
      guides_toggle->tooltip("Show distance and alignment guides in overlay");
      guides_toggle->down_box(FL_DOWN_BOX);
      guides_toggle->callback((Fl_Callback*)guides_cb, (void*)(4));
    } // Fl_Check_Button* guides_toggle
    { Fl_Button* o = new Fl_Button(240, 210, 60, 25, "Close");
      o->tooltip("Close this dialog.");
      o->callback((Fl_Callback*)cb_Close2);
    } // Fl_Button* o
    { Fl_Box* o = new Fl_Box(47, 10, 70, 25, "Grid:");
      o->labelfont(1);
      o->align(Fl_Align(FL_ALIGN_RIGHT|FL_ALIGN_INSIDE));
    } // Fl_Box* o
    { Fl_Box* o = new Fl_Box(10, 115, 107, 25, "Widget Size:");
      o->labelfont(1);
      o->align(Fl_Align(FL_ALIGN_RIGHT|FL_ALIGN_INSIDE));
    } // Fl_Box* o
    { Fl_Group* o = new Fl_Group(105, 115, 170, 75);
      { def_widget_size[0] = new Fl_Round_Button(115, 115, 70, 25);
        def_widget_size[0]->type(102);
        def_widget_size[0]->down_box(FL_ROUND_DOWN_BOX);
        def_widget_size[0]->callback((Fl_Callback*)default_widget_size_cb, (void*)(8));
      } // Fl_Round_Button* def_widget_size[0]
      { Fl_Box* o = new Fl_Box(130, 115, 50, 25, "tiny");
        o->labelsize(8);
        o->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
      } // Fl_Box* o
      { def_widget_size[1] = new Fl_Round_Button(202, 115, 70, 25);
        def_widget_size[1]->type(102);
        def_widget_size[1]->down_box(FL_ROUND_DOWN_BOX);
        def_widget_size[1]->callback((Fl_Callback*)default_widget_size_cb, (void*)(11));
      } // Fl_Round_Button* def_widget_size[1]
      { Fl_Box* o = new Fl_Box(218, 115, 50, 25, "small");
        o->labelsize(11);
        o->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
      } // Fl_Box* o
      { def_widget_size[2] = new Fl_Round_Button(115, 140, 70, 25);
        def_widget_size[2]->type(102);
        def_widget_size[2]->down_box(FL_ROUND_DOWN_BOX);
        def_widget_size[2]->callback((Fl_Callback*)default_widget_size_cb, (void*)(14));
      } // Fl_Round_Button* def_widget_size[2]
      { Fl_Box* o = new Fl_Box(130, 140, 50, 25, "normal");
        o->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
      } // Fl_Box* o
      { def_widget_size[3] = new Fl_Round_Button(202, 140, 90, 25);
        def_widget_size[3]->type(102);
        def_widget_size[3]->down_box(FL_ROUND_DOWN_BOX);
        def_widget_size[3]->callback((Fl_Callback*)default_widget_size_cb, (void*)(18));
      } // Fl_Round_Button* def_widget_size[3]
      { Fl_Box* o = new Fl_Box(218, 140, 68, 25, "medium");
        o->labelsize(18);
        o->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
      } // Fl_Box* o
      { def_widget_size[4] = new Fl_Round_Button(115, 165, 75, 25);
        def_widget_size[4]->type(102);
        def_widget_size[4]->down_box(FL_ROUND_DOWN_BOX);
        def_widget_size[4]->callback((Fl_Callback*)default_widget_size_cb, (void*)(24));
      } // Fl_Round_Button* def_widget_size[4]
      { Fl_Box* o = new Fl_Box(130, 165, 64, 25, "large");
        o->labelsize(24);
        o->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
      } // Fl_Box* o
      { def_widget_size[5] = new Fl_Round_Button(202, 165, 95, 25);
        def_widget_size[5]->type(102);
        def_widget_size[5]->down_box(FL_ROUND_DOWN_BOX);
        def_widget_size[5]->callback((Fl_Callback*)default_widget_size_cb, (void*)(32));
      } // Fl_Round_Button* def_widget_size[5]
      { Fl_Box* o = new Fl_Box(218, 165, 76, 25, "huge");
        o->labelsize(32);
        o->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    grid_window->set_non_modal();
    grid_window->end();
  } // Fl_Double_Window* grid_window
  return grid_window;
}